

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O1

uint64_t basisu::pack_eac_a8(pack_eac_a8_results *results,uint8_t *pPixels,uint32_t num_pixels,
                            uint32_t base_search_rad,uint32_t mul_search_rad,uint32_t table_mask)

{
  uint8_vec uVar1;
  byte bVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint32_t uVar15;
  ulong uVar16;
  uint uVar17;
  uint32_t uVar18;
  undefined1 *puVar19;
  uint uVar20;
  uint32_t uVar21;
  ulong uVar22;
  uint32_t uVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined4 in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  uint32_t new_size;
  
  uVar7 = (results->m_selectors).m_size;
  if (uVar7 != num_pixels) {
    if (uVar7 <= num_pixels) {
      if ((results->m_selectors).m_capacity < num_pixels) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&results->m_selectors,num_pixels,uVar7 + 1 == num_pixels,1,
                   (object_mover)0x0,false);
      }
      uVar7 = (results->m_selectors).m_size;
      memset((results->m_selectors).m_p + uVar7,0,(ulong)(num_pixels - uVar7));
    }
    (results->m_selectors).m_size = num_pixels;
  }
  uVar7 = (results->m_selectors_temp).m_size;
  if (uVar7 != num_pixels) {
    if (uVar7 <= num_pixels) {
      if ((results->m_selectors_temp).m_capacity < num_pixels) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&results->m_selectors_temp,num_pixels,uVar7 + 1 == num_pixels
                   ,1,(object_mover)0x0,false);
      }
      uVar7 = (results->m_selectors_temp).m_size;
      memset((results->m_selectors_temp).m_p + uVar7,0,(ulong)(num_pixels - uVar7));
    }
    (results->m_selectors_temp).m_size = num_pixels;
  }
  auVar6 = _DAT_0027d8c0;
  if (num_pixels == 0) {
    uVar7 = 0xff;
    uVar17 = 0;
  }
  else {
    uVar16 = 0;
    uVar7 = 0xff;
    uVar17 = 0;
    do {
      bVar2 = pPixels[uVar16];
      if (bVar2 <= uVar7) {
        uVar7 = (uint)bVar2;
      }
      uVar20 = (uint)bVar2;
      if (bVar2 < uVar17) {
        uVar20 = uVar17;
      }
      uVar17 = uVar20;
      uVar16 = uVar16 + 1;
    } while (num_pixels != uVar16);
  }
  if (uVar17 - uVar7 == 0) {
    results->m_base = uVar7;
    results->m_table = 0xd;
    results->m_multiplier = 1;
    if (num_pixels == 0) {
LAB_0022ec8b:
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      uVar11 = 0;
      do {
        if ((results->m_selectors).m_size <= uVar11) {
LAB_0022ec9f:
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x178,
                        "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]");
        }
        (results->m_selectors).m_p[uVar11] = '\x04';
        uVar11 = uVar11 + 1;
      } while (num_pixels != uVar11);
    }
  }
  else {
    uVar16 = 0xffffffffffffffff;
    puVar19 = &g_etc2_eac_tables;
    lVar14 = 0;
    do {
      if ((table_mask >> ((uint)lVar14 & 0x1f) & 1) != 0) {
        fVar29 = (float)((int)*(char *)((long)&DAT_003221b4 + lVar14 * 8 + 3) -
                        (int)(char)(&DAT_003221b3)[lVar14 * 8]);
        fVar32 = ((float)-(int)(char)(&DAT_003221b3)[lVar14 * 8] / fVar29) *
                 ((float)uVar17 - (float)uVar7) + (float)uVar7;
        auVar33 = ZEXT416((uint)fVar32 & 0x80000000) | auVar6;
        auVar33._0_4_ = auVar33._0_4_ + fVar32;
        auVar33 = roundss(ZEXT816(0),auVar33,0xb);
        uVar10 = (int)auVar33._0_4_ - base_search_rad;
        uVar20 = (int)~uVar10 >> 0x1f;
        if (uVar10 < 0x100) {
          uVar20 = uVar10;
        }
        uVar20 = uVar20 & 0xff;
        uVar8 = (int)auVar33._0_4_ + base_search_rad;
        uVar10 = (int)~uVar8 >> 0x1f;
        if (uVar8 < 0x100) {
          uVar10 = uVar8;
        }
        uVar10 = uVar10 & 0xff;
        fVar29 = (float)(uVar17 - uVar7) / fVar29;
        auVar30._0_8_ = CONCAT44(in_XMM2_Db,fVar29) & 0x8000000080000000;
        auVar30._8_4_ = in_XMM2_Dc & 0x80000000;
        auVar30._12_4_ = in_XMM2_Dd & 0x80000000;
        auVar30 = auVar30 | auVar6;
        auVar31._4_12_ = auVar30._4_12_;
        auVar31._0_4_ = auVar30._0_4_ + fVar29;
        auVar33 = roundss(auVar31,auVar31,0xb);
        uVar21 = (int)auVar33._0_4_ - mul_search_rad;
        if (0xe < (int)uVar21) {
          uVar21 = 0xf;
        }
        uVar15 = 1;
        if (1 < (int)uVar21) {
          uVar15 = uVar21;
        }
        uVar18 = (int)auVar33._0_4_ + mul_search_rad;
        if (0xe < (int)uVar18) {
          uVar18 = 0xf;
        }
        bVar27 = uVar10 < uVar20;
        if (uVar20 <= uVar10) {
          uVar9 = 1;
          if (1 < (int)uVar18) {
            uVar9 = uVar18;
          }
          do {
            uVar23 = uVar15;
            bVar28 = (int)uVar9 < (int)uVar21;
            if ((int)uVar21 <= (int)uVar9) {
              do {
                if (num_pixels == 0) {
                  uVar11 = 0;
                }
                else {
                  uVar22 = 0;
                  uVar11 = 0;
                  do {
                    uVar8 = 0xffffffff;
                    uVar25 = 0;
                    uVar12 = 0;
                    do {
                      uVar24 = (int)(char)puVar19[uVar25] * uVar23 + uVar20;
                      uVar13 = (int)~uVar24 >> 0x1f;
                      if (uVar24 < 0x100) {
                        uVar13 = uVar24;
                      }
                      uVar24 = (uint)pPixels[uVar22] - (uVar13 & 0xff);
                      uVar13 = -uVar24;
                      if (0 < (int)uVar24) {
                        uVar13 = uVar24;
                      }
                      if (uVar13 < uVar8) {
                        uVar12 = uVar25 & 0xffffffff;
                        uVar8 = uVar13;
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != 8);
                    if ((results->m_selectors_temp).m_size <= (uint)uVar22) goto LAB_0022ec9f;
                    (results->m_selectors_temp).m_p[uVar22] = (uchar)uVar12;
                    uVar11 = uVar11 + uVar8 * uVar8;
                  } while ((uVar11 < uVar16) &&
                          (uVar8 = (uint)uVar22 + 1, uVar22 = (ulong)uVar8, uVar8 < num_pixels));
                }
                bVar26 = uVar11 < uVar16;
                if (bVar26) {
                  results->m_base = uVar20;
                  results->m_multiplier = uVar23;
                  results->m_table = (uint)lVar14;
                  uVar1 = results->m_selectors;
                  uVar3 = *(undefined4 *)((long)&(results->m_selectors_temp).m_p + 4);
                  uVar4 = (results->m_selectors_temp).m_size;
                  uVar5 = (results->m_selectors_temp).m_capacity;
                  *(undefined4 *)&(results->m_selectors).m_p =
                       *(undefined4 *)&(results->m_selectors_temp).m_p;
                  *(undefined4 *)((long)&(results->m_selectors).m_p + 4) = uVar3;
                  (results->m_selectors).m_size = uVar4;
                  (results->m_selectors).m_capacity = uVar5;
                  results->m_selectors_temp = uVar1;
                  uVar16 = uVar11;
                }
                if (bVar26 && uVar11 == 0) break;
                bVar28 = (int)uVar18 <= (int)uVar23;
                bVar26 = (int)uVar23 < (int)uVar18;
                uVar23 = uVar23 + 1;
              } while (bVar26);
            }
            if (!bVar28) break;
            bVar27 = uVar10 <= uVar20;
            bVar28 = uVar20 != uVar10;
            uVar20 = uVar20 + 1;
          } while (bVar28);
        }
        if (!bVar27) goto LAB_0022ec8b;
      }
      lVar14 = lVar14 + 1;
      puVar19 = puVar19 + 8;
    } while (lVar14 != 0x10);
  }
  return uVar16;
}

Assistant:

uint64_t pack_eac_a8(pack_eac_a8_results& results, const uint8_t* pPixels, uint32_t num_pixels, uint32_t base_search_rad, uint32_t mul_search_rad, uint32_t table_mask)
	{
		results.m_selectors.resize(num_pixels);
		results.m_selectors_temp.resize(num_pixels);

		uint32_t min_alpha = 255, max_alpha = 0;
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const uint32_t a = pPixels[i];
			if (a < min_alpha) min_alpha = a;
			if (a > max_alpha) max_alpha = a;
		}

		if (min_alpha == max_alpha)
		{
			results.m_base = min_alpha;
			results.m_table = 13;
			results.m_multiplier = 1;
			for (uint32_t i = 0; i < num_pixels; i++)
				results.m_selectors[i] = 4;
			return 0;
		}

		const uint32_t alpha_range = max_alpha - min_alpha;

		uint64_t best_err = UINT64_MAX;

		for (uint32_t table = 0; table < 16; table++)
		{
			if ((table_mask & (1U << table)) == 0)
				continue;

			const float range = (float)(g_etc2_eac_tables[table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]);
			const int center = (int)roundf(lerp((float)min_alpha, (float)max_alpha, (float)(0 - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

			const int base_min = clamp255(center - base_search_rad);
			const int base_max = clamp255(center + base_search_rad);

			const int mul = (int)roundf(alpha_range / range);
			const int mul_low = clamp<int>(mul - mul_search_rad, 1, 15);
			const int mul_high = clamp<int>(mul + mul_search_rad, 1, 15);

			for (int base = base_min; base <= base_max; base++)
			{
				for (int multiplier = mul_low; multiplier <= mul_high; multiplier++)
				{
					uint64_t total_err = 0;

					for (uint32_t i = 0; i < num_pixels; i++)
					{
						const int a = pPixels[i];

						uint32_t best_s_err = UINT32_MAX;
						uint32_t best_s = 0;
						for (uint32_t s = 0; s < 8; s++)
						{
							const int v = clamp255((int)multiplier * g_etc2_eac_tables[table][s] + (int)base);

							uint32_t err = iabs(a - v);
							if (err < best_s_err)
							{
								best_s_err = err;
								best_s = s;
							}
						}

						results.m_selectors_temp[i] = static_cast<uint8_t>(best_s);

						total_err += best_s_err * best_s_err;
						if (total_err >= best_err)
							break;
					}

					if (total_err < best_err)
					{
						best_err = total_err;
						results.m_base = base;
						results.m_multiplier = multiplier;
						results.m_table = table;
						results.m_selectors.swap(results.m_selectors_temp);
						if (!best_err)
							return best_err;
					}

				} // table

			} // multiplier

		} // base

		return best_err;
	}